

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O2

void __thiscall Assimp::MDLImporter::SetupMaterialProperties_3DGS_MDL5_Quake1(MDLImporter *this)

{
  uchar *puVar1;
  aiTexture *this_00;
  aiColor4D aVar2;
  _IEEESingle temp;
  aiMaterial **ppaVar3;
  aiMaterial *paVar4;
  aiScene *paVar5;
  float fVar6;
  aiColor4D local_438;
  int iMode;
  aiString local_424;
  
  puVar1 = this->mBuffer;
  ppaVar3 = (aiMaterial **)operator_new__(8);
  this->pScene->mMaterials = ppaVar3;
  paVar4 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(paVar4);
  *this->pScene->mMaterials = paVar4;
  this->pScene->mNumMaterials = 1;
  iMode = 2;
  paVar4 = *this->pScene->mMaterials;
  aiMaterial::AddProperty<int>(paVar4,&iMode,1,"$mat.shadingm",0,0);
  local_438.r = 0.0;
  local_438.g = 0.0;
  local_438.b = 0.0;
  local_438.a = 0.0;
  if ((*(int *)(puVar1 + 0x30) != 0) && (this->pScene->mNumTextures != 0)) {
    local_438 = ReplaceTextureWithColor(this,*this->pScene->mTextures);
    if ((~(uint)local_438.r & 0x7f800000) == 0 &&
        ((undefined1  [16])local_438 & (undefined1  [16])0x7fffff) != (undefined1  [16])0x0) {
      local_438.b = 1.0;
      local_438.a = 1.0;
      local_438.r = 1.0;
      local_438.g = 1.0;
      memset(local_424.data + 3,0x1b,0x3fd);
      local_424.data[0] = '*';
      local_424.data[1] = '0';
      local_424.data[2] = '\0';
      local_424.length = 2;
      aiMaterial::AddProperty(paVar4,&local_424,"$tex.file",1,0);
    }
    else {
      this_00 = *this->pScene->mTextures;
      if (this_00 != (aiTexture *)0x0) {
        aiTexture::~aiTexture(this_00);
      }
      operator_delete(this_00,0x428);
      paVar5 = this->pScene;
      if (paVar5->mTextures != (aiTexture **)0x0) {
        operator_delete__(paVar5->mTextures);
        paVar5 = this->pScene;
      }
      paVar5->mTextures = (aiTexture **)0x0;
      this->pScene->mNumTextures = 0;
    }
  }
  aiMaterial::AddProperty<aiColor4t<float>>(paVar4,&local_438,1,"$clr.diffuse",0,0);
  aiMaterial::AddProperty<aiColor4t<float>>(paVar4,&local_438,1,"$clr.specular",0,0);
  aVar2 = local_438;
  fVar6 = local_438.r;
  local_438.g = local_438.g * 0.05;
  local_438.r = fVar6 * 0.05;
  local_438.b = aVar2.b;
  local_438.b = local_438.b * 0.05;
  local_438.a = 1.0;
  aiMaterial::AddProperty<aiColor4t<float>>(paVar4,&local_438,1,"$clr.ambient",0,0);
  return;
}

Assistant:

void MDLImporter::SetupMaterialProperties_3DGS_MDL5_Quake1( )
{
    const MDL::Header* const pcHeader = (const MDL::Header*)this->mBuffer;

    // allocate ONE material
    pScene->mMaterials    = new aiMaterial*[1];
    pScene->mMaterials[0] = new aiMaterial();
    pScene->mNumMaterials = 1;

    // setup the material's properties
    const int iMode = (int)aiShadingMode_Gouraud;
    aiMaterial* const pcHelper = (aiMaterial*)pScene->mMaterials[0];
    pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

    aiColor4D clr;
    if (0 != pcHeader->num_skins && pScene->mNumTextures)   {
        // can we replace the texture with a single color?
        clr = this->ReplaceTextureWithColor(pScene->mTextures[0]);
        if (is_not_qnan(clr.r)) {
            delete pScene->mTextures[0];
            delete[] pScene->mTextures;

            pScene->mTextures = NULL;
            pScene->mNumTextures = 0;
        }
        else    {
            clr.b = clr.a = clr.g = clr.r = 1.0f;
            aiString szString;
            ::memcpy(szString.data,AI_MAKE_EMBEDDED_TEXNAME(0),3);
            szString.length = 2;
            pcHelper->AddProperty(&szString,AI_MATKEY_TEXTURE_DIFFUSE(0));
        }
    }

    pcHelper->AddProperty<aiColor4D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
    pcHelper->AddProperty<aiColor4D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

    clr.r *= 0.05f;clr.g *= 0.05f;
    clr.b *= 0.05f;clr.a  = 1.0f;
    pcHelper->AddProperty<aiColor4D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);
}